

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O2

void mpp_frame_set_meta(MppFrame frame,MppMeta meta)

{
  MPP_RET MVar1;
  
  MVar1 = _check_is_mpp_frame("mpp_frame_set_meta",frame);
  if (MVar1 == MPP_OK) {
    if (*(MppMeta *)((long)frame + 0xb0) != (MppMeta)0x0) {
      mpp_meta_put(*(MppMeta *)((long)frame + 0xb0));
    }
    *(MppMeta *)((long)frame + 0xb0) = meta;
  }
  return;
}

Assistant:

void mpp_frame_set_meta(MppFrame frame, MppMeta meta)
{
    if (check_is_mpp_frame(frame))
        return ;

    MppFrameImpl *p = (MppFrameImpl *)frame;
    if (p->meta) {
        mpp_meta_put(p->meta);
        p->meta = NULL;
    }

    p->meta = meta;
}